

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

TrackDescriptor * __thiscall
perfetto::protos::gen::TrackDescriptor::operator=(TrackDescriptor *this,TrackDescriptor *param_1)

{
  _Head_base<0UL,_perfetto::protos::gen::ChromeThreadDescriptor_*,_false> _Var1;
  _Head_base<0UL,_perfetto::protos::gen::ChromeThreadDescriptor_*,_false> _Var2;
  uint64_t uVar3;
  int32_t iVar4;
  
  uVar3 = param_1->parent_uuid_;
  this->uuid_ = param_1->uuid_;
  this->parent_uuid_ = uVar3;
  ::std::__cxx11::string::_M_assign((string *)&this->name_);
  ProcessDescriptor::operator=
            ((this->process_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ProcessDescriptor,_std::default_delete<perfetto::protos::gen::ProcessDescriptor>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ProcessDescriptor_*,_std::default_delete<perfetto::protos::gen::ProcessDescriptor>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ProcessDescriptor_*,_false>._M_head_impl,
             (param_1->process_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::ProcessDescriptor,_std::default_delete<perfetto::protos::gen::ProcessDescriptor>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::ProcessDescriptor_*,_std::default_delete<perfetto::protos::gen::ProcessDescriptor>_>
             .super__Head_base<0UL,_perfetto::protos::gen::ProcessDescriptor_*,_false>._M_head_impl)
  ;
  protozero::CopyablePtr<perfetto::protos::gen::ChromeProcessDescriptor>::operator=
            (&this->chrome_process_,&param_1->chrome_process_);
  protozero::CopyablePtr<perfetto::protos::gen::ThreadDescriptor>::operator=
            (&this->thread_,&param_1->thread_);
  _Var1._M_head_impl =
       (param_1->chrome_thread_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::ChromeThreadDescriptor,_std::default_delete<perfetto::protos::gen::ChromeThreadDescriptor>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeThreadDescriptor_*,_std::default_delete<perfetto::protos::gen::ChromeThreadDescriptor>_>
       .super__Head_base<0UL,_perfetto::protos::gen::ChromeThreadDescriptor_*,_false>._M_head_impl;
  _Var2._M_head_impl =
       (this->chrome_thread_).ptr_._M_t.
       super___uniq_ptr_impl<perfetto::protos::gen::ChromeThreadDescriptor,_std::default_delete<perfetto::protos::gen::ChromeThreadDescriptor>_>
       ._M_t.
       super__Tuple_impl<0UL,_perfetto::protos::gen::ChromeThreadDescriptor_*,_std::default_delete<perfetto::protos::gen::ChromeThreadDescriptor>_>
       .super__Head_base<0UL,_perfetto::protos::gen::ChromeThreadDescriptor_*,_false>._M_head_impl;
  iVar4 = (_Var1._M_head_impl)->legacy_sort_index_;
  (_Var2._M_head_impl)->thread_type_ = (_Var1._M_head_impl)->thread_type_;
  (_Var2._M_head_impl)->legacy_sort_index_ = iVar4;
  ::std::__cxx11::string::_M_assign((string *)&(_Var2._M_head_impl)->unknown_fields_);
  ((_Var2._M_head_impl)->_has_field_).super__Base_bitset<1UL> =
       (_Base_bitset<1UL>)((_Var1._M_head_impl)->_has_field_).super__Base_bitset<1UL>._M_w;
  CounterDescriptor::operator=
            ((this->counter_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::CounterDescriptor,_std::default_delete<perfetto::protos::gen::CounterDescriptor>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::CounterDescriptor_*,_std::default_delete<perfetto::protos::gen::CounterDescriptor>_>
             .super__Head_base<0UL,_perfetto::protos::gen::CounterDescriptor_*,_false>._M_head_impl,
             (param_1->counter_).ptr_._M_t.
             super___uniq_ptr_impl<perfetto::protos::gen::CounterDescriptor,_std::default_delete<perfetto::protos::gen::CounterDescriptor>_>
             ._M_t.
             super__Tuple_impl<0UL,_perfetto::protos::gen::CounterDescriptor_*,_std::default_delete<perfetto::protos::gen::CounterDescriptor>_>
             .super__Head_base<0UL,_perfetto::protos::gen::CounterDescriptor_*,_false>._M_head_impl)
  ;
  ::std::__cxx11::string::_M_assign((string *)&this->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return this;
}

Assistant:

TrackDescriptor::TrackDescriptor(const TrackDescriptor&) = default;